

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleGlobalMode(cmSetPropertyCommand *this)

{
  bool bVar1;
  cmake *this_00;
  char *local_90;
  char *local_68;
  char *value;
  string *name;
  cmake *cm;
  allocator local_39;
  string local_38;
  cmSetPropertyCommand *local_18;
  cmSetPropertyCommand *this_local;
  
  local_18 = this;
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Names);
  if (bVar1) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    local_68 = (char *)std::__cxx11::string::c_str();
    if ((this->Remove & 1U) != 0) {
      local_68 = (char *)0x0;
    }
    if ((this->AppendMode & 1U) == 0) {
      cmake::SetProperty(this_00,&this->PropertyName,local_68);
    }
    else {
      if (local_68 == (char *)0x0) {
        local_90 = "";
      }
      else {
        local_90 = local_68;
      }
      cmake::AppendProperty(this_00,&this->PropertyName,local_90,(bool)(this->AppendAsString & 1));
    }
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"given names for GLOBAL scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmSetPropertyCommand::HandleGlobalMode()
{
  if (!this->Names.empty()) {
    this->SetError("given names for GLOBAL scope.");
    return false;
  }

  // Set or append the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = CM_NULLPTR;
  }
  if (this->AppendMode) {
    cm->AppendProperty(name, value ? value : "", this->AppendAsString);
  } else {
    cm->SetProperty(name, value);
  }

  return true;
}